

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rply.c
# Opt level: O3

int ply_read(p_ply ply)

{
  t_ply_argument *ptVar1;
  double *pdVar2;
  p_ply_element ptVar3;
  p_ply_property ptVar4;
  p_ply_element ptVar5;
  p_ply_property ptVar6;
  p_ply_read_cb p_Var7;
  p_ply_idriver ptVar8;
  p_ply_ihandler p_Var9;
  int iVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  double local_48;
  long local_40;
  long local_38;
  
  if (((ply == (p_ply)0x0) || (ply->fp == (FILE *)0x0)) || (ply->io_mode != PLY_READ)) {
    __assert_fail("ply && ply->fp && ply->io_mode == PLY_READ",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]trico/rply/rply.c"
                  ,0x1bf,"int ply_read(p_ply)");
  }
  lVar11 = ply->nelements;
  if (0 < lVar11) {
    ptVar1 = &ply->argument;
    pdVar2 = &(ply->argument).value;
    lVar13 = 0;
    do {
      ptVar5 = ply->element;
      ptVar3 = ptVar5 + lVar13;
      (ply->argument).element = ptVar3;
      lVar12 = ptVar5[lVar13].ninstances;
      if (0 < lVar12) {
        lVar11 = ptVar3->nproperties;
        local_38 = 0;
        local_40 = lVar13;
        do {
          (ply->argument).instance_index = local_38;
          if (0 < lVar11) {
            lVar13 = 0;
            do {
              ptVar6 = ptVar3->property;
              ptVar4 = ptVar6 + lVar13;
              (ply->argument).property = ptVar4;
              (ply->argument).pdata = ptVar6[lVar13].pdata;
              (ply->argument).idata = ptVar6[lVar13].idata;
              p_Var7 = ptVar6[lVar13].read_cb;
              ptVar8 = ply->idriver;
              if ((ulong)ptVar6[lVar13].type == 0x10) {
                iVar10 = (*ptVar8->ihandler[ptVar4->length_type])(ply,&local_48);
                if (iVar10 == 0) {
                  ply_ferror(ply,"Error reading \'%s\' of \'%s\' number %d",ptVar4,ptVar3,
                             (ply->argument).instance_index);
                  return 0;
                }
                lVar11 = (long)local_48;
                (ply->argument).length = lVar11;
                (ply->argument).value_index = -1;
                (ply->argument).value = local_48;
                if (p_Var7 != (p_ply_read_cb)0x0) {
                  iVar10 = (*p_Var7)(ptVar1);
                  if (iVar10 == 0) {
LAB_0011820b:
                    ply_ferror(ply,"Aborted by user");
                    return 0;
                  }
                  lVar11 = (long)local_48;
                }
                if (0 < lVar11) {
                  p_Var9 = ptVar8->ihandler[ptVar4->value_type];
                  lVar11 = 0;
                  do {
                    (ply->argument).value_index = lVar11;
                    iVar10 = (*p_Var9)(ply,pdVar2);
                    if (iVar10 == 0) {
                      ply_ferror(ply,"Error reading value number %d of \'%s\' of \'%s\' number %d",
                                 (ulong)((int)lVar11 + 1),ptVar4,ptVar3,
                                 (ply->argument).instance_index);
                      return 0;
                    }
                    if ((p_Var7 != (p_ply_read_cb)0x0) && (iVar10 = (*p_Var7)(ptVar1), iVar10 == 0))
                    goto LAB_0011820b;
                    lVar11 = lVar11 + 1;
                  } while (lVar11 < (long)local_48);
                }
              }
              else {
                p_Var9 = ptVar8->ihandler[ptVar6[lVar13].type];
                (ply->argument).length = 1;
                (ply->argument).value_index = 0;
                iVar10 = (*p_Var9)(ply,pdVar2);
                if (iVar10 == 0) {
                  ply_ferror(ply,"Error reading \'%s\' of \'%s\' number %d",ptVar4,ptVar3,
                             (ply->argument).instance_index);
                  return 0;
                }
                if ((p_Var7 != (p_ply_read_cb)0x0) && (iVar10 = (*p_Var7)(ptVar1), iVar10 == 0)) {
                  ply_ferror(ply,"Aborted by user");
                  return 0;
                }
              }
              lVar13 = lVar13 + 1;
              lVar11 = ptVar3->nproperties;
            } while (lVar13 < lVar11);
            lVar12 = ptVar3->ninstances;
            lVar13 = local_40;
          }
          local_38 = local_38 + 1;
        } while (local_38 < lVar12);
        lVar11 = ply->nelements;
      }
      lVar13 = lVar13 + 1;
    } while (lVar13 < lVar11);
  }
  return 1;
}

Assistant:

int ply_read(p_ply ply) {
    long i;
    p_ply_argument argument;
    assert(ply && ply->fp && ply->io_mode == PLY_READ);
    argument = &ply->argument;
    /* for each element type */
    for (i = 0; i < ply->nelements; i++) {
        p_ply_element element = &ply->element[i];
        argument->element = element;
        if (!ply_read_element(ply, element, argument))
            return 0;
    }
    return 1;
}